

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_alt_helpers.cpp
# Opt level: O0

int mbedtls_rsa_validate_params
              (mbedtls_mpi *N,mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *E,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  mbedtls_mpi *in_RCX;
  mbedtls_mpi *in_RDX;
  mbedtls_mpi *in_RSI;
  mbedtls_mpi *in_RDI;
  mbedtls_mpi *in_R8;
  mbedtls_mpi *in_R9;
  mbedtls_mpi L;
  mbedtls_mpi K;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffffa8;
  mbedtls_mpi *in_stack_ffffffffffffffb0;
  mbedtls_mpi *in_stack_ffffffffffffffb8;
  mbedtls_mpi *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  int iVar2;
  
  iVar2 = 0;
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffb8);
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffa8);
  if (((in_RSI != (mbedtls_mpi *)0x0) && (in_RDX != (mbedtls_mpi *)0x0)) &&
     (in_RDI != (mbedtls_mpi *)0x0)) {
    iVar2 = mbedtls_mpi_mul_mpi(in_RSI,in_RDX,in_RCX);
    if (iVar2 != 0) goto LAB_02731d4a;
    iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                (mbedtls_mpi_sint)in_stack_ffffffffffffffb8);
    if ((iVar1 < 1) ||
       (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&stack0xffffffffffffffb8,in_RDI), iVar1 != 0)) {
      iVar2 = -0x4200;
      goto LAB_02731d4a;
    }
  }
  if (((in_RDI == (mbedtls_mpi *)0x0) || (in_RCX == (mbedtls_mpi *)0x0)) ||
     ((in_R8 == (mbedtls_mpi *)0x0 ||
      ((((iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                      (mbedtls_mpi_sint)in_stack_ffffffffffffffb8), 0 < iVar1 &&
         (iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                      (mbedtls_mpi_sint)in_stack_ffffffffffffffb8), 0 < iVar1)) &&
        (iVar1 = mbedtls_mpi_cmp_mpi(in_RCX,in_RDI), iVar1 < 0)) &&
       (iVar1 = mbedtls_mpi_cmp_mpi(in_R8,in_RDI), iVar1 < 0)))))) {
    if (((in_RSI != (mbedtls_mpi *)0x0) && (in_RDX != (mbedtls_mpi *)0x0)) &&
       ((in_RCX != (mbedtls_mpi *)0x0 && (in_R8 != (mbedtls_mpi *)0x0)))) {
      iVar2 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                  (mbedtls_mpi_sint)in_stack_ffffffffffffffb8);
      if ((iVar2 < 1) ||
         (iVar2 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                      (mbedtls_mpi_sint)in_stack_ffffffffffffffb8), iVar2 < 1)) {
        iVar2 = -0x4200;
      }
      else {
        iVar2 = mbedtls_mpi_mul_mpi(in_RSI,in_RDX,in_RCX);
        if ((iVar2 == 0) &&
           (((iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)(ulong)in_stack_ffffffffffffffc8,
                                          (mbedtls_mpi_sint)in_stack_ffffffffffffffc0), iVar2 == 0
             && (iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)(ulong)in_stack_ffffffffffffffc8,
                                             (mbedtls_mpi_sint)in_stack_ffffffffffffffc0),
                iVar2 == 0)) &&
            (iVar2 = mbedtls_mpi_mod_mpi(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                         in_stack_ffffffffffffffa8), iVar2 == 0)))) {
          iVar2 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                      (mbedtls_mpi_sint)in_stack_ffffffffffffffb8);
          if (iVar2 == 0) {
            iVar2 = mbedtls_mpi_mul_mpi(in_RSI,in_RDX,in_RCX);
            if (((iVar2 == 0) &&
                (iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)(ulong)in_stack_ffffffffffffffc8,
                                             (mbedtls_mpi_sint)in_stack_ffffffffffffffc0),
                iVar2 == 0)) &&
               ((iVar2 = mbedtls_mpi_sub_int(in_R9,(mbedtls_mpi *)(ulong)in_stack_ffffffffffffffc8,
                                             (mbedtls_mpi_sint)in_stack_ffffffffffffffc0),
                iVar2 == 0 &&
                ((iVar2 = mbedtls_mpi_mod_mpi(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                              in_stack_ffffffffffffffa8), iVar2 == 0 &&
                 (iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffffc0,
                                              (mbedtls_mpi_sint)in_stack_ffffffffffffffb8),
                 iVar1 != 0)))))) {
              iVar2 = -0x4200;
            }
          }
          else {
            iVar2 = -0x4200;
          }
        }
      }
    }
  }
  else {
    iVar2 = -0x4200;
  }
LAB_02731d4a:
  mbedtls_mpi_free((mbedtls_mpi *)0x2731d54);
  mbedtls_mpi_free((mbedtls_mpi *)0x2731d5c);
  if ((iVar2 != 0) && (iVar2 != -0x4200)) {
    iVar2 = iVar2 + -0x4200;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_validate_params(const mbedtls_mpi *N, const mbedtls_mpi *P,
                                const mbedtls_mpi *Q, const mbedtls_mpi *D,
                                const mbedtls_mpi *E,
                                int (*f_rng)(void *, unsigned char *, size_t),
                                void *p_rng)
{
    int ret = 0;
    mbedtls_mpi K, L;

    mbedtls_mpi_init(&K);
    mbedtls_mpi_init(&L);

    /*
     * Step 1: If PRNG provided, check that P and Q are prime
     */

#if defined(MBEDTLS_GENPRIME)
    /*
     * When generating keys, the strongest security we support aims for an error
     * rate of at most 2^-100 and we are aiming for the same certainty here as
     * well.
     */
    if (f_rng != NULL && P != NULL &&
        (ret = mbedtls_mpi_is_prime_ext(P, 50, f_rng, p_rng)) != 0) {
        ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
        goto cleanup;
    }

    if (f_rng != NULL && Q != NULL &&
        (ret = mbedtls_mpi_is_prime_ext(Q, 50, f_rng, p_rng)) != 0) {
        ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
        goto cleanup;
    }
#else
    ((void) f_rng);
    ((void) p_rng);
#endif /* MBEDTLS_GENPRIME */

    /*
     * Step 2: Check that 1 < N = P * Q
     */

    if (P != NULL && Q != NULL && N != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, P, Q));
        if (mbedtls_mpi_cmp_int(N, 1)  <= 0 ||
            mbedtls_mpi_cmp_mpi(&K, N) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /*
     * Step 3: Check and 1 < D, E < N if present.
     */

    if (N != NULL && D != NULL && E != NULL) {
        if (mbedtls_mpi_cmp_int(D, 1) <= 0 ||
            mbedtls_mpi_cmp_int(E, 1) <= 0 ||
            mbedtls_mpi_cmp_mpi(D, N) >= 0 ||
            mbedtls_mpi_cmp_mpi(E, N) >= 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /*
     * Step 4: Check that D, E are inverse modulo P-1 and Q-1
     */

    if (P != NULL && Q != NULL && D != NULL && E != NULL) {
        if (mbedtls_mpi_cmp_int(P, 1) <= 0 ||
            mbedtls_mpi_cmp_int(Q, 1) <= 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }

        /* Compute DE-1 mod P-1 */
        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, D, E));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, &K, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&L, P, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&K, &K, &L));
        if (mbedtls_mpi_cmp_int(&K, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }

        /* Compute DE-1 mod Q-1 */
        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, D, E));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, &K, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&L, Q, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&K, &K, &L));
        if (mbedtls_mpi_cmp_int(&K, 0) != 0) {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

cleanup:

    mbedtls_mpi_free(&K);
    mbedtls_mpi_free(&L);

    /* Wrap MPI error codes by RSA check failure error code */
    if (ret != 0 && ret != MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) {
        ret += MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    return ret;
}